

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::IncludeGuard_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FileDescriptor *file,bool pb_h,Options *options)

{
  bool bVar1;
  char *__rhs;
  undefined7 in_register_00000009;
  Options *extraout_RDX;
  string filename_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  __rhs = "";
  if (((byte)((cpp *)CONCAT71(in_register_00000009,pb_h))[0x21] & (byte)file) != 0) {
    __rhs = ".pb.h";
  }
  std::operator+(&local_80,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,__rhs);
  FilenameIdentifier(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = IsWellKnownMessage((FileDescriptor *)this);
  if (bVar1) {
    MacroPrefix_abi_cxx11_(&local_40,(cpp *)CONCAT71(in_register_00000009,pb_h),extraout_RDX);
    std::operator+(&local_80,&local_40,"_INCLUDED_");
    std::operator+(__return_storage_ptr__,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::operator+(__return_storage_ptr__,"GOOGLE_PROTOBUF_INCLUDED_",&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::string IncludeGuard(const FileDescriptor* file, bool pb_h,
                                const Options& options) {
  // If we are generating a .pb.h file and the proto_h option is enabled, then
  // the .pb.h gets an extra suffix.
  std::string filename_identifier = FilenameIdentifier(
      file->name() + (pb_h && options.proto_h ? ".pb.h" : ""));

  if (IsWellKnownMessage(file)) {
    // For well-known messages we need third_party/protobuf and net/proto2 to
    // have distinct include guards, because some source files include both and
    // both need to be defined (the third_party copies will be in the
    // google::protobuf_opensource namespace).
    return MacroPrefix(options) + "_INCLUDED_" + filename_identifier;
  } else {
    // Ideally this case would use distinct include guards for opensource and
    // google3 protos also.  (The behavior of "first #included wins" is not
    // ideal).  But unfortunately some legacy code includes both and depends on
    // the identical include guards to avoid compile errors.
    //
    // We should clean this up so that this case can be removed.
    return "GOOGLE_PROTOBUF_INCLUDED_" + filename_identifier;
  }
}